

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

void ppc_tlb_invalidate_all_ppc64(CPUPPCState_conflict2 *env)

{
  ulong *puVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  char *fmt;
  
  if ((env->mmu_model >> 0x10 & 1) != 0) {
switchD_00b5994a_caseD_1:
    env->tlb_need_flush = 0;
    goto switchD_00b5994a_caseD_8;
  }
  switch(env->mmu_model) {
  case POWERPC_MMU_32B:
  case POWERPC_MMU_601:
    goto switchD_00b5994a_caseD_1;
  case POWERPC_MMU_SOFT_6xx:
  case POWERPC_MMU_SOFT_74xx:
    if (0 < env->nb_tlb) {
      uVar4 = env->nb_tlb << (env->id_tlbs == 1);
      uVar6 = 1;
      if (1 < (int)uVar4) {
        uVar6 = (ulong)uVar4;
      }
      lVar5 = 0;
      do {
        puVar1 = (ulong *)((long)&((env->tlb).tlb6)->pte0 + lVar5);
        *puVar1 = *puVar1 & 0x7fffffff;
        lVar5 = lVar5 + 0x18;
      } while (uVar6 * 0x18 != lVar5);
    }
    break;
  case POWERPC_MMU_SOFT_4xx:
  case POWERPC_MMU_SOFT_4xx_Z:
    iVar3 = env->nb_tlb;
    if (0 < (long)iVar3) {
      lVar5 = 0;
      do {
        puVar2 = (uint *)((long)&((env->tlb).tlbe)->prot + lVar5);
        *puVar2 = *puVar2 & 0xfffffff7;
        lVar5 = lVar5 + 0x28;
      } while ((long)iVar3 * 0x28 != lVar5);
    }
    break;
  case POWERPC_MMU_REAL:
    fmt = "No TLB for PowerPC 4xx in real mode\n";
    goto LAB_00b599fd;
  case POWERPC_MMU_MPC8xx:
    fmt = "MPC8xx MMU model is not implemented\n";
LAB_00b599fd:
    cpu_abort_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,fmt);
  case POWERPC_MMU_BOOKE:
    break;
  case POWERPC_MMU_BOOKE206:
    booke206_flush_tlb(env,-1,0);
    return;
  default:
    cpu_abort_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write,"Unknown MMU model %x\n");
  }
switchD_00b5994a_caseD_8:
  tlb_flush_ppc64((CPUState *)&env[-1].spr_cb[0x1bf].oea_write);
  return;
}

Assistant:

void ppc_tlb_invalidate_all(CPUPPCState *env)
{
#if defined(TARGET_PPC64)
    if (env->mmu_model & POWERPC_MMU_64) {
        env->tlb_need_flush = 0;
        tlb_flush(env_cpu(env));
    } else
#endif /* defined(TARGET_PPC64) */
    switch (env->mmu_model) {
    case POWERPC_MMU_SOFT_6xx:
    case POWERPC_MMU_SOFT_74xx:
        ppc6xx_tlb_invalidate_all(env);
        break;
    case POWERPC_MMU_SOFT_4xx:
    case POWERPC_MMU_SOFT_4xx_Z:
        ppc4xx_tlb_invalidate_all(env);
        break;
    case POWERPC_MMU_REAL:
        cpu_abort(env_cpu(env), "No TLB for PowerPC 4xx in real mode\n");
        break;
    case POWERPC_MMU_MPC8xx:
        /* XXX: TODO */
        cpu_abort(env_cpu(env), "MPC8xx MMU model is not implemented\n");
        break;
    case POWERPC_MMU_BOOKE:
        tlb_flush(env_cpu(env));
        break;
    case POWERPC_MMU_BOOKE206:
        booke206_flush_tlb(env, -1, 0);
        break;
    case POWERPC_MMU_32B:
    case POWERPC_MMU_601:
        env->tlb_need_flush = 0;
        tlb_flush(env_cpu(env));
        break;
    default:
        /* XXX: TODO */
        cpu_abort(env_cpu(env), "Unknown MMU model %x\n", env->mmu_model);
        break;
    }
}